

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O0

__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
 burst::
 select_min<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
           (__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
            first,__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
                  last,
           compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
           compare)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  *p_Var4;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  local_38;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  current;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  min;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  _Stack_20;
  compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  compare_local;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  last_local;
  __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
  first_local;
  
  _Stack_20._M_current = last._M_current;
  last_local = first;
  bVar1 = __gnu_cxx::operator!=(&last_local,&stack0xffffffffffffffe0);
  if (bVar1) {
    current = last_local;
    local_38 = std::
               next<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>>
                         (last_local,1);
    while (bVar1 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffe0), bVar1) {
      piVar2 = __gnu_cxx::
               __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
               ::operator*(&local_38);
      piVar3 = __gnu_cxx::
               __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
               ::operator*(&current);
      bVar1 = compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>
              ::operator()((void *)((long)&min._M_current + 5),piVar2,piVar3);
      if (bVar1) {
        std::
        iter_swap<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>>
                  (last_local,local_38);
        current = last_local;
      }
      else {
        piVar2 = __gnu_cxx::
                 __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
                 ::operator*(&current);
        piVar3 = __gnu_cxx::
                 __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
                 ::operator*(&local_38);
        bVar1 = compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>
                ::operator()((void *)((long)&min._M_current + 5),piVar2,piVar3);
        if (!bVar1) {
          __gnu_cxx::
          __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
          ::operator++(&current);
          bVar1 = __gnu_cxx::operator!=(&current,&local_38);
          if (bVar1) {
            std::
            iter_swap<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>>*,std::vector<boost::iterator_range<std::_List_const_iterator<char>>,std::allocator<boost::iterator_range<std::_List_const_iterator<char>>>>>>
                      (current,local_38);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
      ::operator++(&local_38);
    }
    p_Var4 = __gnu_cxx::
             __normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
             ::operator++(&current);
    first_local._M_current = p_Var4->_M_current;
  }
  else {
    first_local = last_local;
  }
  return (__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
          )(__normal_iterator<boost::iterator_range<std::_List_const_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_const_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<char>_>_>_>_>
            )first_local._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }